

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

void inner_loop<true,true>
               (cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float cost,
               uint32_t *prediction,float *score,float *partial_prediction,bool query_this_label,
               bool *query_needed)

{
  float fVar1;
  vw *pvVar2;
  shared_data *psVar3;
  float fVar4;
  
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(i - 1));
  pvVar2 = cs_a->all;
  (ec->l).simple.weight = 1.0;
  ec->weight = 1.0;
  if (query_this_label) {
    (ec->l).simple.label = cost;
    psVar3 = pvVar2->sd;
    psVar3->queries = psVar3->queries + 1;
    fVar4 = (ec->l).simple.label;
    if ((fVar4 != 3.4028235e+38) || (NAN(fVar4))) {
      LEARNER::learner<char,_example>::learn(base,ec,(ulong)(i - 1));
    }
  }
  else {
    (ec->l).multi.label = 0x7f7fffff;
  }
  fVar4 = ec->partial_prediction;
  *partial_prediction = fVar4;
  fVar1 = *score;
  if ((fVar4 < fVar1) || (((fVar4 == fVar1 && (!NAN(fVar4) && !NAN(fVar1))) && (i < *prediction))))
  {
    *score = fVar4;
    *prediction = i;
    fVar4 = ec->partial_prediction;
  }
  add_passthrough_feature_magic(ec,0x398d4541,(ulong)i,fVar4);
  return;
}

Assistant:

inline void inner_loop(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction,
    float& score, float& partial_prediction, bool query_this_label, bool& query_needed)
{
  base.predict(ec, i - 1);
  // cerr << "base.predict ==> partial_prediction=" << ec.partial_prediction << endl;
  if (is_learn)
  {
    vw& all = *cs_a.all;
    ec.l.simple.weight = 1.;
    ec.weight = 1.;
    if (is_simulation)
    {
      // In simulation mode
      if (query_this_label)
      {
        ec.l.simple.label = cost;
        all.sd->queries += 1;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }
    else
    {
      // In reduction mode.
      // If the cost of this label was previously queried, then it should be available for learning now.
      // If the cost of this label was not queried, then skip it.
      if (query_needed)
      {
        ec.l.simple.label = cost;
        if ((cost < cs_a.cost_min) || (cost > cs_a.cost_max))
          cerr << "warning: cost " << cost << " outside of cost range [" << cs_a.cost_min << ", " << cs_a.cost_max
               << "]!" << endl;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }

    if (ec.l.simple.label != FLT_MAX)
      base.learn(ec, i - 1);
  }
  else if (!is_simulation)
    // Prediction in reduction mode could be used by upper layer to ask whether this label needs to be queried.
    // So we return that.
    query_needed = query_this_label;

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}